

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O3

void InterpreterThunkEmitter::FillBuffer
               (ThreadContextInfo *threadContext,bool asmJsThunk,intptr_t finalAddr,
               size_t bufferSize,BYTE *buffer,PRUNTIME_FUNCTION *pdataTableStart,
               intptr_t *epilogEndAddr,DWORD *thunkCount)

{
  BYTE *pdataBuffer;
  bool bVar1;
  DWORD DVar2;
  uintptr_t interpreterThunk;
  long epilogStart;
  undefined4 *puVar3;
  DWORD epilogSize;
  uint uVar4;
  size_t sizeInBytes;
  undefined7 in_register_00000031;
  code *pcVar5;
  DWORD DVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  BYTE *pBVar12;
  undefined1 local_140 [8];
  PrologEncoder prologEncoder;
  
  EhFrame::EhFrame((EhFrame *)local_140,(BYTE *)&prologEncoder.ehFrame.fde.pcBeginOffset,0x80);
  prologEncoder.buffer[0x78] = '\0';
  prologEncoder.buffer[0x79] = '\0';
  prologEncoder.buffer[0x7a] = '\0';
  prologEncoder.buffer[0x7b] = '\0';
  prologEncoder.buffer[0x7c] = '\0';
  prologEncoder.buffer[0x7d] = '\0';
  prologEncoder.buffer[0x7e] = '\0';
  prologEncoder.buffer[0x7f] = '\0';
  prologEncoder.cfiInstrOffset = 0;
  prologEncoder.currentInstrOffset._0_4_ = 1;
  DVar6 = 0;
  PrologEncoder::EncodeSmallProlog((PrologEncoder *)local_140,'<',0);
  DVar2 = PrologEncoder::SizeOfPData((PrologEncoder *)local_140);
  if ((int)CONCAT71(in_register_00000031,asmJsThunk) == 0) {
    pcVar5 = Js::InterpreterStackFrame::InterpreterThunk;
  }
  else {
    pcVar5 = Js::InterpreterStackFrame::InterpreterAsmThunk;
  }
  interpreterThunk = ShiftAddr(threadContext,(uintptr_t)pcVar5);
  uVar7 = DVar2 + 0xf & 0xfffffff0;
  uVar11 = (ulong)(0x1000 - uVar7);
  epilogStart = uVar11 + finalAddr + -0x10;
  epilogSize = 0x48;
  js_memcpy_s(buffer,0x1000,(anonymous_namespace)::InterpreterThunk,0x48);
  EncodeInterpreterThunk(buffer,finalAddr,epilogStart,epilogSize,interpreterThunk);
  pBVar12 = buffer + 0x48;
  uVar4 = 0xfb8;
  if (pBVar12 < buffer + (uVar11 - 0x18)) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    prologEncoder._192_8_ = ZEXT48(-uVar7);
    DVar6 = 0;
    sizeInBytes = 0xfb8;
    do {
      js_memcpy_s(pBVar12,sizeInBytes,&(anonymous_namespace)::Call,8);
      iVar8 = prologEncoder.cfaWordOffset + (int)sizeInBytes + -0x17;
      if (iVar8 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar1 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                           ,0x221,"(offset >= 0)","offset >= 0");
        if (!bVar1) goto LAB_005652a5;
        *puVar3 = 0;
      }
      if (*(int *)(pBVar12 + 3) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar1 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.h"
                           ,0x76,"(*(T*) (dest + offset) == 0)",
                           "Overwriting an already existing opcode?");
        if (!bVar1) goto LAB_005652a5;
        *puVar3 = 0;
      }
      *(int *)(pBVar12 + 3) = iVar8;
      pBVar12 = pBVar12 + 8;
      uVar4 = (int)sizeInBytes - 8;
      sizeInBytes = (size_t)uVar4;
      DVar6 = DVar6 + 1;
    } while (pBVar12 < buffer + (uVar11 - 0x18));
  }
  uVar9 = ((int)buffer + (0x1000 - uVar7) + -0x10) - (int)pBVar12;
  Memory::CustomHeap::FillDebugBreak(pBVar12,(ulong)uVar9);
  uVar4 = uVar4 - uVar9;
  pBVar12 = pBVar12 + uVar9;
  js_memcpy_s(pBVar12,(ulong)uVar4,&(anonymous_namespace)::Epilog,2);
  if (uVar4 - 2 < 0xe) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x311,"(alignPad <= (sizeInBytes - srcSize))",
                       "alignPad <= (sizeInBytes - srcSize)");
    if (!bVar1) goto LAB_005652a5;
    *puVar3 = 0;
    lVar10 = 2;
  }
  else {
    Memory::CustomHeap::FillDebugBreak(pBVar12 + 2,0xe);
    lVar10 = 0x10;
  }
  pdataBuffer = buffer + uVar11;
  if (pdataBuffer != pBVar12 + lVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x237,"(pdataStart == currentBuffer)","pdataStart == currentBuffer");
    if (!bVar1) goto LAB_005652a5;
    *puVar3 = 0;
  }
  uVar4 = uVar4 - (int)lVar10;
  if (uVar4 < DVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x239,"(bytesRemaining >= pdataSize)","bytesRemaining >= pdataSize");
    if (!bVar1) goto LAB_005652a5;
    *puVar3 = 0;
  }
  pBVar12 = PrologEncoder::Finalize
                      ((PrologEncoder *)local_140,buffer,((int)pdataBuffer - (int)buffer) - 0xe,
                       pdataBuffer);
  js_memcpy_s(pdataBuffer,(ulong)uVar4,pBVar12,(ulong)DVar2);
  if (uVar4 - DVar2 < uVar7 - DVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x311,"(alignPad <= (sizeInBytes - srcSize))",
                       "alignPad <= (sizeInBytes - srcSize)");
    if (!bVar1) {
LAB_005652a5:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar3 = 0;
  }
  else if (uVar7 != DVar2) {
    Memory::CustomHeap::FillDebugBreak(pdataBuffer + DVar2,(ulong)(uVar7 - DVar2));
  }
  *pdataTableStart = (PRUNTIME_FUNCTION)(uVar11 + finalAddr);
  *epilogEndAddr = epilogStart;
  *thunkCount = DVar6;
  return;
}

Assistant:

void InterpreterThunkEmitter::FillBuffer(
    _In_ ThreadContextInfo * threadContext,
    _In_ bool asmJsThunk,
    _In_ intptr_t finalAddr,
    _In_ size_t bufferSize,
    _Out_writes_bytes_all_(BlockSize) BYTE* buffer,
#if PDATA_ENABLED
    _Out_ PRUNTIME_FUNCTION * pdataTableStart,
    _Out_ intptr_t * epilogEndAddr,
#endif
    _Out_ DWORD * thunkCount
    )
{
#ifdef _M_X64
    PrologEncoder prologEncoder;
    prologEncoder.EncodeSmallProlog(PrologSize, StackAllocSize);
    DWORD pdataSize = prologEncoder.SizeOfPData();
#elif defined(_M_ARM32_OR_ARM64)
    DWORD pdataSize = sizeof(RUNTIME_FUNCTION);
#else
    DWORD pdataSize = 0;
#endif
    DWORD bytesRemaining = BlockSize;
    DWORD bytesWritten = 0;
    DWORD thunks = 0;
    DWORD epilogSize = sizeof(Epilog);
    const BYTE *epilog = Epilog;
    const BYTE *header = InterpreterThunk;

    intptr_t interpreterThunk;

    // the static interpreter thunk invoked by the dynamic emitted thunk
#ifdef ASMJS_PLAT
    if (asmJsThunk)
    {
        interpreterThunk = ShiftAddr(threadContext, &Js::InterpreterStackFrame::InterpreterAsmThunk);
    }
    else
#endif
    {
        interpreterThunk = ShiftAddr(threadContext, &Js::InterpreterStackFrame::InterpreterThunk);
    }


    BYTE * currentBuffer = buffer;
    // Ensure there is space for PDATA at the end
    BYTE* pdataStart = currentBuffer + (BlockSize - Math::Align(pdataSize, EMIT_BUFFER_ALIGNMENT));
    BYTE* epilogStart = pdataStart - Math::Align(epilogSize, EMIT_BUFFER_ALIGNMENT);

    // Ensure there is space for PDATA at the end
    intptr_t finalPdataStart = finalAddr + (BlockSize - Math::Align(pdataSize, EMIT_BUFFER_ALIGNMENT));
    intptr_t finalEpilogStart = finalPdataStart - Math::Align(epilogSize, EMIT_BUFFER_ALIGNMENT);

    // Copy the thunk buffer and modify it.
    js_memcpy_s(currentBuffer, bytesRemaining, header, HeaderSize);
    EncodeInterpreterThunk(currentBuffer, finalAddr, finalEpilogStart, epilogSize, interpreterThunk);
    currentBuffer += HeaderSize;
    bytesRemaining -= HeaderSize;

    // Copy call buffer
    DWORD callSize = sizeof(Call);
    while (currentBuffer < epilogStart - callSize)
    {
        js_memcpy_s(currentBuffer, bytesRemaining, Call, callSize);
#if _M_ARM
        int offset = (epilogStart - (currentBuffer + JmpOffset));
        Assert(offset >= 0);
        DWORD encodedOffset = EncoderMD::BranchOffset_T2_24(offset);
        DWORD encodedBranch = /*opcode=*/ 0x9000F000 | encodedOffset;
        Emit(currentBuffer, JmpOffset, encodedBranch);
#elif _M_ARM64
        int64 offset = (epilogStart - (currentBuffer + JmpOffset));
        Assert(offset >= 0);
        DWORD encodedOffset = EncoderMD::BranchOffset_26(offset);
        DWORD encodedBranch = /*opcode=*/ 0x14000000 | encodedOffset;
        Emit(currentBuffer, JmpOffset, encodedBranch);
#else
        // jump requires an offset from the end of the jump instruction.
        int offset = (int)(epilogStart - (currentBuffer + JmpOffset + sizeof(int)));
        Assert(offset >= 0);
        Emit(currentBuffer, JmpOffset, offset);
#endif
        currentBuffer += callSize;
        bytesRemaining -= callSize;
        thunks++;
    }

    // Fill any gap till start of epilog
    bytesWritten = FillDebugBreak(currentBuffer, (DWORD)(epilogStart - currentBuffer));
    bytesRemaining -= bytesWritten;
    currentBuffer += bytesWritten;

    // Copy epilog
    bytesWritten = CopyWithAlignment(currentBuffer, bytesRemaining, epilog, epilogSize, EMIT_BUFFER_ALIGNMENT);
    currentBuffer += bytesWritten;
    bytesRemaining -= bytesWritten;

    // Generate and register PDATA
#if PDATA_ENABLED
    BYTE* epilogEnd = epilogStart + epilogSize;
    DWORD functionSize = (DWORD)(epilogEnd - buffer);
    Assert(pdataStart == currentBuffer);
#ifdef _M_X64
    Assert(bytesRemaining >= pdataSize);
    BYTE* pdata = prologEncoder.Finalize(buffer, functionSize, pdataStart);
    bytesWritten = CopyWithAlignment(pdataStart, bytesRemaining, pdata, pdataSize, EMIT_BUFFER_ALIGNMENT);
#elif defined(_M_ARM32_OR_ARM64)
    RUNTIME_FUNCTION pdata;
    GeneratePdata(buffer, functionSize, &pdata);
    bytesWritten = CopyWithAlignment(pdataStart, bytesRemaining, (const BYTE*)&pdata, pdataSize, EMIT_BUFFER_ALIGNMENT);
#endif
    *pdataTableStart = (PRUNTIME_FUNCTION)finalPdataStart;
    *epilogEndAddr = finalEpilogStart;
#endif
    *thunkCount = thunks;
}